

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O3

void k053260_write(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  undefined1 uVar9;
  
  uVar7 = (ulong)data;
  uVar2 = offset & 0x3f;
  if ((byte)((char)uVar2 - 8U) < 0x20) {
    uVar2 = uVar2 - 8 >> 3;
    switch(offset & 7) {
    case 0:
      *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x2a) =
           (ushort)data | *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x2a) & 0xf00;
      return;
    case 1:
      *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2b) = data & 0xf;
      return;
    case 2:
      *(UINT8 *)((long)chip + (ulong)uVar2 * 0x28 + 0x28) = data;
      return;
    case 3:
      *(UINT8 *)((long)chip + (ulong)uVar2 * 0x28 + 0x29) = data;
      return;
    case 4:
      uVar4 = *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) & 0x1fff00;
      uVar6 = (uint)data;
      break;
    case 5:
      uVar4 = *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) & 0x1f00ff;
      uVar6 = (uint)data << 8;
      break;
    case 6:
      *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x26) = data & 0x1f;
      return;
    case 7:
      bVar5 = data & 0x7f;
      *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2c) = bVar5;
      bVar1 = *(byte *)((long)chip + (ulong)uVar2 * 0x28 + 0x2d);
      *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x1c) = (8 - (ushort)bVar1) * (ushort)bVar5;
      *(ushort *)((long)chip + (ulong)uVar2 * 0x28 + 0x1e) = (ushort)bVar1 * (ushort)bVar5;
      return;
    }
    *(uint *)((long)chip + (ulong)uVar2 * 0x28 + 0x24) = uVar6 | uVar4;
    return;
  }
  switch(uVar2) {
  case 0x28:
    bVar1 = *(byte *)((long)chip + 0xc);
    puVar8 = (uint *)((long)chip + 0x18);
    lVar3 = 0;
    do {
      if (((~bVar1 & data) >> ((uint)lVar3 & 0x1f) & 1) == 0) {
        if ((1 << ((byte)lVar3 & 0x1f) & (uint)data) == 0) {
          *puVar8 = 0;
          uVar9 = 0;
          goto LAB_0016a173;
        }
      }
      else {
        *puVar8 = (uint)(*(char *)((long)puVar8 + 0x17) != '\0');
        *(undefined2 *)(puVar8 + 2) = 0xffff;
        uVar9 = 1;
LAB_0016a173:
        *(undefined1 *)((long)puVar8 + 10) = 0;
        *(undefined1 *)((long)puVar8 + 0xb) = uVar9;
      }
      lVar3 = lVar3 + 1;
      puVar8 = puVar8 + 10;
      if (lVar3 == 4) {
        *(UINT8 *)((long)chip + 0xc) = data;
        return;
      }
    } while( true );
  case 0x29:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2a:
    lVar3 = 0x2f;
    do {
      *(byte *)((long)chip + lVar3 + -1) = (byte)uVar7 & 1;
      *(byte *)((long)chip + lVar3) = (byte)uVar7 & 0x10;
      uVar7 = uVar7 >> 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0xcf);
    break;
  case 0x2c:
    bVar1 = data & 7;
    *(byte *)((long)chip + 0x2d) = bVar1;
    *(ushort *)((long)chip + 0x1c) = (8 - (ushort)bVar1) * (ushort)*(byte *)((long)chip + 0x2c);
    *(ushort *)((long)chip + 0x1e) = (ushort)*(byte *)((long)chip + 0x2c) * (ushort)bVar1;
    bVar1 = data >> 3 & 7;
    *(byte *)((long)chip + 0x55) = bVar1;
    *(ushort *)((long)chip + 0x44) = (8 - (ushort)bVar1) * (ushort)*(byte *)((long)chip + 0x54);
    *(ushort *)((long)chip + 0x46) = (ushort)*(byte *)((long)chip + 0x54) * (ushort)bVar1;
    return;
  case 0x2d:
    bVar1 = data & 7;
    *(byte *)((long)chip + 0x7d) = bVar1;
    *(ushort *)((long)chip + 0x6c) = (8 - (ushort)bVar1) * (ushort)*(byte *)((long)chip + 0x7c);
    *(ushort *)((long)chip + 0x6e) = (ushort)*(byte *)((long)chip + 0x7c) * (ushort)bVar1;
    bVar1 = data >> 3 & 7;
    *(byte *)((long)chip + 0xa5) = bVar1;
    *(ushort *)((long)chip + 0x94) = (8 - (ushort)bVar1) * (ushort)*(byte *)((long)chip + 0xa4);
    *(ushort *)((long)chip + 0x96) = (ushort)*(byte *)((long)chip + 0xa4) * (ushort)bVar1;
    return;
  case 0x2f:
    *(UINT8 *)((long)chip + 0xd) = data;
    return;
  default:
    if (uVar2 - 2 < 2) {
      *(UINT8 *)((long)chip + (ulong)uVar2 + 8) = data;
      return;
    }
  }
  return;
}

Assistant:

static void k053260_write(void* chip, UINT8 offset, UINT8 data)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	offset &= 0x3f;

	// per voice registers
	if ((offset >= 0x08) && (offset <= 0x27))
	{
		KDSC_set_register(&info->voice[(offset - 8) / 8], offset, data);
		return;
	}

	switch (offset)
	{
		// 0x00 and 0x01 are read registers

		case 0x02: // sub-to-main ports
		case 0x03:
			info->portdata[offset] = data;
			break;

		// 0x04 through 0x07 seem to be unused

		case 0x28: // key on/off
		{
			UINT8 rising_edge = data & ~info->keyon;

			for (i = 0; i < 4; i++)
			{
				if (rising_edge & (1 << i))
					KDSC_key_on(&info->voice[i]);
				else if (!(data & (1 << i)))
					KDSC_key_off(&info->voice[i]);
			}
			info->keyon = data;
			break;
		}

		// 0x29 is a read register

		case 0x2a: // loop and pcm/adpcm select
			for (i = 0; i < 4; i++)
			{
				KDSC_set_loop_kadpcm(&info->voice[i], data);
				data >>= 1;
			}
			break;

		// 0x2b seems to be unused

		case 0x2c: // pan, voices 0 and 1
			KDSC_set_pan(&info->voice[0], data);
			KDSC_set_pan(&info->voice[1], data >> 3);
			break;

		case 0x2d: // pan, voices 2 and 3
			KDSC_set_pan(&info->voice[2], data);
			KDSC_set_pan(&info->voice[3], data >> 3);
			break;

		// 0x2e is a read register

		case 0x2f: // control
			info->mode = data;
			// bit 0 = enable ROM read from register 0x2e
			// bit 1 = enable sound output
			// bit 2 = enable aux input?
			//   (set by all games except Golfing Greats and Rollergames, both of which
			//    don't have a YM2151. Over Drive only sets it on one of the two chips)
			// bit 3 = aux input or ROM sharing related?
			//   (only set by Over Drive, and only on the same chip that bit 2 is set on)
			break;

		default:
			logerror("Write to unknown K053260 register %02x (data = %02x)\n",
					offset, data);
	}
}